

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCof.c
# Opt level: O0

DdNode * cuddCofactorRecur(DdManager *dd,DdNode *f,DdNode *g)

{
  uint uVar1;
  uint uVar2;
  DdNode *f_00;
  DdNode *pDVar3;
  DdNode *pDVar4;
  int comple;
  uint topg;
  uint topf;
  DdNode *r;
  DdNode *e;
  DdNode *t;
  DdNode *f0;
  DdNode *f1;
  DdNode *g0;
  DdNode *g1;
  DdNode *G;
  DdNode *F;
  DdNode *zero;
  DdNode *one;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  f_00 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  dd_local = (DdManager *)f;
  if ((f_00->index != 0x7fffffff) && (pDVar4 = dd->one, g != pDVar4)) {
    pDVar3 = cuddCacheLookup2(dd,Cudd_Cofactor,f_00,g);
    if (pDVar3 == (DdNode *)0x0) {
      uVar1 = dd->perm[f_00->index];
      pDVar3 = (DdNode *)((ulong)g & 0xfffffffffffffffe);
      uVar2 = dd->perm[pDVar3->index];
      t = f_00;
      f0 = f_00;
      if (uVar1 <= uVar2) {
        t = (f_00->type).kids.E;
        f0 = (f_00->type).kids.T;
      }
      f1 = g;
      g0 = g;
      if (uVar2 <= uVar1) {
        g0 = (pDVar3->type).kids.T;
        f1 = (pDVar3->type).kids.E;
        if (g != pDVar3) {
          g0 = (DdNode *)((ulong)g0 ^ 1);
          f1 = (DdNode *)((ulong)f1 ^ 1);
        }
      }
      pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
      if (uVar1 < uVar2) {
        pDVar4 = cuddCofactorRecur(dd,f0,g);
        if (pDVar4 == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
        pDVar3 = cuddCofactorRecur(dd,t,g);
        if (pDVar3 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar4);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
        _topg = pDVar4;
        if (pDVar4 != pDVar3) {
          if (((ulong)pDVar4 & 1) == 0) {
            _topg = cuddUniqueInter(dd,f_00->index,pDVar4,pDVar3);
          }
          else {
            _topg = cuddUniqueInter(dd,f_00->index,(DdNode *)((ulong)pDVar4 ^ 1),
                                    (DdNode *)((ulong)pDVar3 ^ 1));
            if (_topg != (DdNode *)0x0) {
              _topg = (DdNode *)((ulong)_topg ^ 1);
            }
          }
        }
        if (_topg == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar3);
          Cudd_RecursiveDeref(dd,pDVar4);
          return (DdNode *)0x0;
        }
        *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + -1;
        *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + -1;
      }
      else {
        if ((f1 == pDVar4) || (f1 == dd->zero)) {
          _topg = cuddCofactorRecur(dd,f0,g0);
        }
        else {
          if ((g0 != pDVar4) && (g0 != dd->zero)) {
            fprintf((FILE *)dd->out,"Cudd_Cofactor: Invalid restriction 2\n");
            dd->errorCode = CUDD_INVALID_ARG;
            return (DdNode *)0x0;
          }
          _topg = cuddCofactorRecur(dd,t,f1);
        }
        if (_topg == (DdNode *)0x0) {
          return (DdNode *)0x0;
        }
      }
      cuddCacheInsert2(dd,Cudd_Cofactor,f_00,g,_topg);
      dd_local = (DdManager *)((ulong)_topg ^ (long)(int)(uint)(f != f_00));
    }
    else {
      dd_local = (DdManager *)((ulong)pDVar3 ^ (long)(int)(uint)(f != f_00));
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddCofactorRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *one,*zero,*F,*G,*g1,*g0,*f1,*f0,*t,*e,*r;
    unsigned int topf,topg;
    int comple;

    statLine(dd);
    F = Cudd_Regular(f);
    if (cuddIsConstant(F)) return(f);

    one = DD_ONE(dd);

    /* The invariant g != 0 is true on entry to this procedure and is
    ** recursively maintained by it. Therefore it suffices to test g
    ** against one to make sure it is not constant.
    */
    if (g == one) return(f);
    /* From now on, f and g are known not to be constants. */

    comple = f != F;
    r = cuddCacheLookup2(dd,Cudd_Cofactor,F,g);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    topf = dd->perm[F->index];
    G = Cudd_Regular(g);
    topg = dd->perm[G->index];

    /* We take the cofactors of F because we are going to rely on
    ** the fact that the cofactors of the complement are the complements
    ** of the cofactors to better utilize the cache. Variable comple
    ** remembers whether we have to complement the result or not.
    */
    if (topf <= topg) {
        f1 = cuddT(F); f0 = cuddE(F);
    } else {
        f1 = f0 = F;
    }
    if (topg <= topf) {
        g1 = cuddT(G); g0 = cuddE(G);
        if (g != G) { g1 = Cudd_Not(g1); g0 = Cudd_Not(g0); }
    } else {
        g1 = g0 = g;
    }

    zero = Cudd_Not(one);
    if (topf >= topg) {
        if (g0 == zero || g0 == DD_ZERO(dd)) {
            r = cuddCofactorRecur(dd, f1, g1);
        } else if (g1 == zero || g1 == DD_ZERO(dd)) {
            r = cuddCofactorRecur(dd, f0, g0);
        } else {
            (void) fprintf(dd->out,
                           "Cudd_Cofactor: Invalid restriction 2\n");
            dd->errorCode = CUDD_INVALID_ARG;
            return(NULL);
        }
        if (r == NULL) return(NULL);
    } else /* if (topf < topg) */ {
        t = cuddCofactorRecur(dd, f1, g);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddCofactorRecur(dd, f0, g);
        if (e == NULL) {
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        cuddRef(e);

        if (t == e) {
            r = t;
        } else if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(dd,(int)F->index,Cudd_Not(t),Cudd_Not(e));
            if (r != NULL)
                r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(dd,(int)F->index,t,e);
        }
        if (r == NULL) {
            Cudd_RecursiveDeref(dd ,e);
            Cudd_RecursiveDeref(dd ,t);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(dd,Cudd_Cofactor,F,g,r);

    return(Cudd_NotCond(r,comple));

}